

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.h
# Opt level: O0

SequenceFeatureType * __thiscall
CoreML::Specification::FeatureType::mutable_sequencetype(FeatureType *this)

{
  bool bVar1;
  SequenceFeatureType *this_00;
  FeatureType *this_local;
  
  bVar1 = has_sequencetype(this);
  if (!bVar1) {
    clear_Type(this);
    set_has_sequencetype(this);
    this_00 = (SequenceFeatureType *)operator_new(0x28);
    SequenceFeatureType::SequenceFeatureType(this_00);
    (this->Type_).sequencetype_ = this_00;
  }
  return (SequenceFeatureType *)(this->Type_).int64type_;
}

Assistant:

inline ::CoreML::Specification::SequenceFeatureType* FeatureType::mutable_sequencetype() {
  if (!has_sequencetype()) {
    clear_Type();
    set_has_sequencetype();
    Type_.sequencetype_ = new ::CoreML::Specification::SequenceFeatureType;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.FeatureType.sequenceType)
  return Type_.sequencetype_;
}